

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<unsigned_int>::emplaceRealloc<unsigned_int_const&>
          (SmallVectorBase<unsigned_int> *this,pointer pos,uint *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator puVar4;
  long lVar5;
  pointer puVar6;
  EVP_PKEY_CTX *ctx;
  uint *in_RDX;
  iterator in_RSI;
  SmallVectorBase<unsigned_int> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  uint *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<unsigned_int> *)0x613bcb);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  puVar4 = begin(in_RDI);
  lVar5 = (long)__last - (long)puVar4;
  puVar6 = (pointer)operator_new(0x613c2a);
  puVar6[lVar5 >> 2] = *in_RDX;
  puVar4 = end(in_RDI);
  if (in_RSI == puVar4) {
    puVar4 = begin(in_RDI);
    ctx = (EVP_PKEY_CTX *)end(in_RDI);
    std::uninitialized_move<unsigned_int*,unsigned_int*>(in_RSI,__last,puVar4);
  }
  else {
    begin(in_RDI);
    std::uninitialized_move<unsigned_int*,unsigned_int*>(in_RSI,__last,in_stack_ffffffffffffffa0);
    ctx = (EVP_PKEY_CTX *)end(in_RDI);
    std::uninitialized_move<unsigned_int*,unsigned_int*>(in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,ctx);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = puVar6;
  return puVar6 + (lVar5 >> 2);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}